

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,StringPiece name)

{
  Tables *pTVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  char *str;
  long lVar6;
  char *pcVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __hash_code __code;
  _Hash_node_base *p_Var10;
  char *pcVar11;
  StringPiece SVar12;
  string prefix;
  key_type local_98;
  Symbol local_90;
  StringPiece local_88;
  string local_78;
  undefined7 uStack_77;
  pointer local_70;
  size_t asStack_68 [3];
  string local_50;
  
  local_88.length_ = name.length_;
  local_88.ptr_ = name.ptr_;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,&local_88);
  do {
    lVar6 = std::__cxx11::string::rfind((char)&local_50,0x2e);
    if (lVar6 == -1) {
      iVar5 = 2;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_50);
      std::__cxx11::string::operator=((string *)&local_50,&local_78);
      if ((size_t *)CONCAT71(uStack_77,local_78) != asStack_68) {
        operator_delete((size_t *)CONCAT71(uStack_77,local_78));
      }
      sVar3 = local_50._M_string_length;
      _Var2._M_p = local_50._M_dataplus._M_p;
      pTVar1 = (this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
               _M_head_impl;
      if ((long)local_50._M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_50._M_string_length,"string length exceeds max size");
      }
      local_70 = _Var2._M_p;
      asStack_68[0] = sVar3;
      local_78 = (string)0xa;
      local_98.ptr_ = (SymbolBase *)&local_78;
      local_90.ptr_ = (SymbolBase *)&local_78;
      SVar12 = Symbol::full_name(&local_90);
      pcVar7 = SVar12.ptr_;
      if ((long)SVar12.length_ < 1) {
        __code = 0;
      }
      else {
        pcVar11 = pcVar7 + SVar12.length_;
        __code = 0;
        do {
          __code = (long)*pcVar7 + __code * 5;
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 < pcVar11);
      }
      p_Var8 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(pTVar1->symbols_by_name_)._M_h,
                          __code % *(size_type *)((long)&(pTVar1->symbols_by_name_)._M_h + 8),
                          &local_98,__code);
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var9 = p_Var8->_M_nxt;
      }
      p_Var10 = p_Var9 + 1;
      if (p_Var9 == (_Hash_node_base *)0x0) {
        p_Var10 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      }
      p_Var9 = p_Var10->_M_nxt;
      if (((p_Var9 == (_Hash_node_base *)0x0) || (*(char *)&p_Var9->_M_nxt == '\0')) ||
         ((iVar5 = 1, p_Var9 != (_Hash_node_base *)0x0 && (*(char *)&p_Var9->_M_nxt == '\t')))) {
        iVar5 = 0;
      }
    }
  } while (iVar5 == 0);
  if (iVar5 == 2) {
    if (this->underlay_ == (DescriptorPool *)0x0) {
      bVar4 = false;
    }
    else {
      SVar12.length_ = local_88.length_;
      SVar12.ptr_ = local_88.ptr_;
      bVar4 = IsSubSymbolOfBuiltType(this->underlay_,SVar12);
    }
  }
  else {
    bVar4 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(StringPiece name) const {
  auto prefix = std::string(name);
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type() != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}